

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O0

__pid_t __thiscall QWaitCondition::wait(QWaitCondition *this,void *__stat_loc)

{
  StateForWaitCondition SVar1;
  __pid_t _Var2;
  void *in_RDX;
  long in_FS_OFFSET;
  bool returnValue;
  StateForWaitCondition previousState;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff98;
  byte local_49;
  QReadWriteLock *in_stack_ffffffffffffffb8;
  QMessageLogger local_38;
  void *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (__stat_loc == (void *)0x0) {
    local_49 = 0;
  }
  else {
    local_18 = in_RDX;
    SVar1 = QReadWriteLockPrivate::stateForWaitCondition((QReadWriteLock *)this);
    if (SVar1 == Unlocked) {
      local_49 = 0;
    }
    else if (SVar1 == RecursivelyLocked) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)__stat_loc,(char *)CONCAT44(3,in_stack_ffffffffffffff98),
                 (int)((ulong)this >> 0x20),
                 (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      QMessageLogger::warning
                (&local_38,
                 "QWaitCondition: cannot wait on QReadWriteLocks with recursive lockForWrite()");
      local_49 = 0;
    }
    else {
      pthread_mutex_lock((pthread_mutex_t *)this->d);
      qt_report_pthread_error
                ((int)((ulong)this >> 0x20),
                 (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                 (char *)0x6d9d9e);
      this->d->waiters = this->d->waiters + 1;
      QReadWriteLock::unlock(in_stack_ffffffffffffffb8);
      _Var2 = QWaitConditionPrivate::wait(this->d,local_18);
      local_49 = (byte)_Var2 & 1;
      if (SVar1 == LockedForWrite) {
        QReadWriteLock::lockForWrite
                  ((QReadWriteLock *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      }
      else {
        QReadWriteLock::lockForRead
                  ((QReadWriteLock *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      }
      local_49 = local_49 & 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (__pid_t)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_49);
  }
  __stack_chk_fail();
}

Assistant:

bool QWaitCondition::wait(QReadWriteLock *readWriteLock, QDeadlineTimer deadline)
{
    using namespace QReadWriteLockStates;

    if (!readWriteLock)
        return false;
    auto previousState = QReadWriteLockPrivate::stateForWaitCondition(readWriteLock);
    if (previousState == Unlocked)
        return false;
    if (previousState == RecursivelyLocked) {
        qWarning("QWaitCondition: cannot wait on QReadWriteLocks with recursive lockForWrite()");
        return false;
    }

    qt_report_pthread_error(pthread_mutex_lock(&d->mutex), "QWaitCondition::wait()", "mutex lock");
    ++d->waiters;

    readWriteLock->unlock();

    bool returnValue = d->wait(deadline);

    if (previousState == LockedForWrite)
        readWriteLock->lockForWrite();
    else
        readWriteLock->lockForRead();

    return returnValue;
}